

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O1

positionTy * __thiscall
DataRefs::GetUsersPlanePos
          (positionTy *__return_storage_ptr__,DataRefs *this,double *pTrueAirspeed_m,double *pTrack,
          double *pHeightAGL_m)

{
  int iVar1;
  long lVar2;
  positionTy *ppVar3;
  positionTy *ppVar4;
  byte bVar5;
  
  bVar5 = 0;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&mutexDrUpdate);
  if (iVar1 == 0) {
    ppVar3 = &this->lastUsersPlanePos;
    ppVar4 = __return_storage_ptr__;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      ppVar4->_lat = ppVar3->_lat;
      ppVar3 = (positionTy *)((long)ppVar3 + (ulong)bVar5 * -0x10 + 8);
      ppVar4 = (positionTy *)((long)ppVar4 + (ulong)bVar5 * -0x10 + 8);
    }
    if (pTrueAirspeed_m != (double *)0x0) {
      *pTrueAirspeed_m = this->lastUsersTrueAirspeed;
    }
    if (pTrack != (double *)0x0) {
      *pTrack = this->lastUsersTrack;
    }
    if (pHeightAGL_m != (double *)0x0) {
      *pHeightAGL_m = (double)this->lastUsersAGL_ft * 0.3048;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&mutexDrUpdate);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

positionTy DataRefs::GetUsersPlanePos(double* pTrueAirspeed_m,
                                      double* pTrack,
                                      double* pHeightAGL_m) const
{
    // access guarded by a lock
    std::lock_guard<std::recursive_mutex> lock(mutexDrUpdate);

    // Copy the values
    positionTy ret = lastUsersPlanePos;
    if (pTrueAirspeed_m)    *pTrueAirspeed_m    = lastUsersTrueAirspeed;
    if (pTrack)             *pTrack             = lastUsersTrack;
    if (pHeightAGL_m)       *pHeightAGL_m       = lastUsersAGL_ft * M_per_FT;

    return ret;
}